

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,8ul>
::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,8ul> *this,
          TypedID<(diligent_spirv_cross::Types)0> *arg_list_begin,
          TypedID<(diligent_spirv_cross::Types)0> *arg_list_end)

{
  long lVar1;
  size_t i;
  size_t sVar2;
  size_t count;
  
  *(undefined8 *)(this + 8) = 0;
  *(SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,8ul> **)this =
       this + 0x18;
  *(undefined8 *)(this + 0x10) = 8;
  count = (long)arg_list_end - (long)arg_list_begin >> 2;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::reserve
            ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL> *)this
             ,count);
  lVar1 = *(long *)this;
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    *(uint32_t *)(lVar1 + sVar2 * 4) = arg_list_begin[sVar2].id;
  }
  *(size_t *)(this + 8) = count;
  return;
}

Assistant:

SmallVector(const U *arg_list_begin, const U *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}